

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void (anonymous_namespace)::check<Imf_3_2::DeepScanLineInputFile,Imf_3_2::DeepScanLineOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  MultiPartInputFile file_1;
  DeepScanLineOutputFile file;
  Header f;
  MultiPartInputFile local_80 [16];
  long *local_70;
  long local_68;
  long local_60 [2];
  Header local_50 [56];
  
  local_70 = (long *)0x0;
  Imf_3_2::Header::Header(local_50,0x40,0x40,1.0,(Vec2 *)&local_70,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pcVar4 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_70,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar4,(Channel *)"Dummy");
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012eb62;
    }
  }
  else {
LAB_0012eb62:
    Imf_3_2::Header::setType((string *)local_50);
  }
  puVar5 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar5 = 2;
  remove("/var/tmp/badfile.exr");
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            ((DeepScanLineOutputFile *)&local_70,"/var/tmp/badfile.exr",local_50,iVar3);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile((DeepScanLineOutputFile *)&local_70);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_80,"/var/tmp/badfile.exr",iVar3,true);
  if (DAT_001eee58 == DAT_001eeea0) {
    if (DAT_001eee58 != 0) {
      iVar3 = bcmp(Imf_3_2::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001eee58);
      if (iVar3 != 0) goto LAB_0012ec03;
    }
  }
  else {
LAB_0012ec03:
    Imf_3_2::MultiPartInputFile::header((int)local_80);
    puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 == DAT_001eee58) {
      if (sVar1 != 0) {
        iVar3 = bcmp((void *)*puVar6,Imf_3_2::DEEPSCANLINE_abi_cxx11_,sVar1);
        if (iVar3 != 0) goto LAB_0012ec44;
      }
    }
    else {
LAB_0012ec44:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,Imf_3_2::DEEPSCANLINE_abi_cxx11_,DAT_001eee58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
      Imf_3_2::MultiPartInputFile::header((int)local_80);
      puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," from multipart when input type was ",0x24);
      sVar1 = *(size_t *)(filename + 8);
      if (sVar1 == DAT_001eeea0) {
        if (sVar1 != 0) {
          iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
          if (iVar3 != 0) goto LAB_0012ecef;
        }
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"unset","");
      }
      else {
LAB_0012ecef:
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,*(long *)filename,sVar1 + *(long *)filename);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_70,local_68);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
    }
  }
  if (DAT_001eee58 == DAT_001eeea0) {
    if (DAT_001eee58 != 0) {
      iVar3 = bcmp(Imf_3_2::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001eee58);
      if (iVar3 != 0) goto LAB_0012edb1;
    }
  }
  else {
LAB_0012edb1:
    Imf_3_2::MultiPartInputFile::header((int)local_80);
    puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 != DAT_001eee58) {
LAB_0012f062:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepScanLineInputFile, OUT = Imf_3_2::DeepScanLineOutputFile]"
                   );
    }
    if (sVar1 != 0) {
      iVar3 = bcmp((void *)*puVar6,Imf_3_2::DEEPSCANLINE_abi_cxx11_,sVar1);
      if (iVar3 != 0) goto LAB_0012f062;
    }
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_80);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)local_80,"/var/tmp/badfile.exr",iVar3);
  if (DAT_001eee58 == DAT_001eeea0) {
    if (DAT_001eee58 != 0) {
      iVar3 = bcmp(Imf_3_2::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001eee58);
      if (iVar3 != 0) goto LAB_0012ee48;
    }
    Imf_3_2::DeepScanLineInputFile::header();
    cVar2 = Imf_3_2::Header::hasType();
    if (cVar2 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_2::DeepScanLineInputFile::header();
    cVar2 = Imf_3_2::Header::hasType();
    if (cVar2 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepScanLineInputFile, OUT = Imf_3_2::DeepScanLineOutputFile]"
                   );
    }
    goto LAB_0012f038;
  }
LAB_0012ee48:
  Imf_3_2::DeepScanLineInputFile::header();
  puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  sVar1 = puVar6[1];
  if (sVar1 == DAT_001eee58) {
    if (sVar1 == 0) goto LAB_0012f038;
    iVar3 = bcmp((void *)*puVar6,Imf_3_2::DEEPSCANLINE_abi_cxx11_,sVar1);
    if (iVar3 == 0) goto LAB_0012f038;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,Imf_3_2::DEEPSCANLINE_abi_cxx11_,DAT_001eee58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
  Imf_3_2::DeepScanLineInputFile::header();
  puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," when input type was ",0x15);
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012ef38;
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"unset","");
  }
  else {
LAB_0012ef38:
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)filename,sVar1 + *(long *)filename);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_70,local_68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
LAB_0012f038:
  Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)local_80);
  remove("/var/tmp/badfile.exr");
  Imf_3_2::Header::~Header(local_50);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}